

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

int gladLoadGLUserPtr(GLADuserptrloadfunc load,void *userptr)

{
  bool bVar1;
  GLADuserptrloadfunc p_Var2;
  int iVar3;
  GLubyte *pGVar4;
  size_t sVar5;
  char **ppcVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  char **exts_i;
  bool bVar15;
  bool bVar16;
  uint num_exts_i;
  int minor;
  int major;
  uint local_4c;
  undefined8 local_48;
  int local_40;
  int local_3c;
  GLADuserptrloadfunc local_38;
  
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)(userptr,"glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    return 0;
  }
  pGVar4 = (*glad_glGetString)(0x1f02);
  if (pGVar4 == (GLubyte *)0x0) {
    return 0;
  }
  iVar3 = 0;
  local_3c = 0;
  local_40 = 0;
  pGVar4 = (*glad_glGetString)(0x1f02);
  local_38 = load;
  if (pGVar4 != (GLubyte *)0x0) {
    lVar14 = 0;
    do {
      pcVar7 = *(char **)((long)&PTR_anon_var_dwarf_6766_001510e0 + lVar14);
      sVar5 = strlen(pcVar7);
      iVar3 = strncmp((char *)pGVar4,pcVar7,sVar5);
      if (iVar3 != 0) {
        sVar5 = 0;
      }
      pGVar4 = pGVar4 + sVar5;
    } while ((iVar3 != 0) && (bVar15 = lVar14 != 0x18, lVar14 = lVar14 + 8, bVar15));
    __isoc99_sscanf(pGVar4,"%d.%d",&local_3c,&local_40);
    bVar15 = 1 < local_3c;
    GLAD_GL_VERSION_1_1 = (int)bVar15;
    uVar11 = (uint)bVar15;
    bVar1 = 3 < local_3c;
    GLAD_GL_VERSION_3_1 = (int)bVar1;
    uVar10 = (uint)bVar1;
    GLAD_GL_VERSION_3_3 = uVar10;
    GLAD_GL_VERSION_1_3 = uVar11;
    if (2 < local_40) {
      GLAD_GL_VERSION_1_3 = 1;
      GLAD_GL_VERSION_3_3 = 1;
    }
    if (local_3c != 3) {
      GLAD_GL_VERSION_3_3 = uVar10;
    }
    local_48 = CONCAT44(local_48._4_4_,GLAD_GL_VERSION_3_3);
    GLAD_GL_VERSION_3_2 = uVar10;
    GLAD_GL_VERSION_1_2 = uVar11;
    if (1 < local_40) {
      GLAD_GL_VERSION_1_2 = 1;
      GLAD_GL_VERSION_3_2 = 1;
    }
    GLAD_GL_VERSION_2_0 = (int)(2 < local_3c);
    uVar8 = (uint)(2 < local_3c);
    if (local_3c != 3) {
      GLAD_GL_VERSION_3_2 = uVar10;
    }
    bVar16 = -1 < local_40;
    GLAD_GL_VERSION_1_0 = uVar11;
    if (bVar16) {
      GLAD_GL_VERSION_1_0 = 1;
    }
    if (0 < local_40) {
      GLAD_GL_VERSION_1_1 = 1;
    }
    if (bVar16) {
      GLAD_GL_VERSION_2_0 = 1;
    }
    GLAD_GL_VERSION_2_1 = uVar8;
    if (0 < local_40) {
      GLAD_GL_VERSION_2_1 = 1;
    }
    GLAD_GL_VERSION_3_0 = GLAD_GL_VERSION_3_1;
    if (bVar16) {
      GLAD_GL_VERSION_3_0 = 1;
    }
    if (0 < local_40) {
      GLAD_GL_VERSION_3_1 = 1;
    }
    if (local_3c != 3) {
      GLAD_GL_VERSION_3_1 = (uint)bVar1;
      GLAD_GL_VERSION_3_0 = (uint)bVar1;
    }
    if (local_3c != 2) {
      GLAD_GL_VERSION_2_1 = uVar8;
      GLAD_GL_VERSION_2_0 = uVar8;
    }
    GLAD_GL_VERSION_1_4 = uVar11;
    if (3 < local_40) {
      GLAD_GL_VERSION_1_4 = 1;
    }
    GLAD_GL_VERSION_1_5 = uVar11;
    if (4 < local_40) {
      GLAD_GL_VERSION_1_5 = 1;
    }
    uVar10 = (uint)bVar15;
    if (local_3c != 1) {
      GLAD_GL_VERSION_1_5 = uVar10;
      GLAD_GL_VERSION_1_3 = uVar10;
      GLAD_GL_VERSION_1_2 = uVar10;
      GLAD_GL_VERSION_1_0 = uVar10;
      GLAD_GL_VERSION_1_1 = uVar11;
      GLAD_GL_VERSION_1_4 = uVar10;
    }
    iVar3 = local_3c * 10000 + local_40;
  }
  p_Var2 = local_38;
  if (GLAD_GL_VERSION_1_0 != 0) {
    glad_glAccum = (PFNGLACCUMPROC)(*local_38)(userptr,"glAccum");
    glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)(*p_Var2)(userptr,"glAlphaFunc");
    glad_glBegin = (PFNGLBEGINPROC)(*p_Var2)(userptr,"glBegin");
    glad_glBitmap = (PFNGLBITMAPPROC)(*p_Var2)(userptr,"glBitmap");
    glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*p_Var2)(userptr,"glBlendFunc");
    glad_glCallList = (PFNGLCALLLISTPROC)(*p_Var2)(userptr,"glCallList");
    glad_glCallLists = (PFNGLCALLLISTSPROC)(*p_Var2)(userptr,"glCallLists");
    glad_glClear = (PFNGLCLEARPROC)(*p_Var2)(userptr,"glClear");
    glad_glClearAccum = (PFNGLCLEARACCUMPROC)(*p_Var2)(userptr,"glClearAccum");
    glad_glClearColor = (PFNGLCLEARCOLORPROC)(*p_Var2)(userptr,"glClearColor");
    glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*p_Var2)(userptr,"glClearDepth");
    glad_glClearIndex = (PFNGLCLEARINDEXPROC)(*p_Var2)(userptr,"glClearIndex");
    glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*p_Var2)(userptr,"glClearStencil");
    glad_glClipPlane = (PFNGLCLIPPLANEPROC)(*p_Var2)(userptr,"glClipPlane");
    glad_glColor3b = (PFNGLCOLOR3BPROC)(*p_Var2)(userptr,"glColor3b");
    glad_glColor3bv = (PFNGLCOLOR3BVPROC)(*p_Var2)(userptr,"glColor3bv");
    glad_glColor3d = (PFNGLCOLOR3DPROC)(*p_Var2)(userptr,"glColor3d");
    glad_glColor3dv = (PFNGLCOLOR3DVPROC)(*p_Var2)(userptr,"glColor3dv");
    glad_glColor3f = (PFNGLCOLOR3FPROC)(*p_Var2)(userptr,"glColor3f");
    glad_glColor3fv = (PFNGLCOLOR3FVPROC)(*p_Var2)(userptr,"glColor3fv");
    glad_glColor3i = (PFNGLCOLOR3IPROC)(*p_Var2)(userptr,"glColor3i");
    glad_glColor3iv = (PFNGLCOLOR3IVPROC)(*p_Var2)(userptr,"glColor3iv");
    glad_glColor3s = (PFNGLCOLOR3SPROC)(*p_Var2)(userptr,"glColor3s");
    glad_glColor3sv = (PFNGLCOLOR3SVPROC)(*p_Var2)(userptr,"glColor3sv");
    glad_glColor3ub = (PFNGLCOLOR3UBPROC)(*p_Var2)(userptr,"glColor3ub");
    glad_glColor3ubv = (PFNGLCOLOR3UBVPROC)(*p_Var2)(userptr,"glColor3ubv");
    glad_glColor3ui = (PFNGLCOLOR3UIPROC)(*p_Var2)(userptr,"glColor3ui");
    glad_glColor3uiv = (PFNGLCOLOR3UIVPROC)(*p_Var2)(userptr,"glColor3uiv");
    glad_glColor3us = (PFNGLCOLOR3USPROC)(*p_Var2)(userptr,"glColor3us");
    glad_glColor3usv = (PFNGLCOLOR3USVPROC)(*p_Var2)(userptr,"glColor3usv");
    glad_glColor4b = (PFNGLCOLOR4BPROC)(*p_Var2)(userptr,"glColor4b");
    glad_glColor4bv = (PFNGLCOLOR4BVPROC)(*p_Var2)(userptr,"glColor4bv");
    glad_glColor4d = (PFNGLCOLOR4DPROC)(*p_Var2)(userptr,"glColor4d");
    glad_glColor4dv = (PFNGLCOLOR4DVPROC)(*p_Var2)(userptr,"glColor4dv");
    glad_glColor4f = (PFNGLCOLOR4FPROC)(*p_Var2)(userptr,"glColor4f");
    glad_glColor4fv = (PFNGLCOLOR4FVPROC)(*p_Var2)(userptr,"glColor4fv");
    glad_glColor4i = (PFNGLCOLOR4IPROC)(*p_Var2)(userptr,"glColor4i");
    glad_glColor4iv = (PFNGLCOLOR4IVPROC)(*p_Var2)(userptr,"glColor4iv");
    glad_glColor4s = (PFNGLCOLOR4SPROC)(*p_Var2)(userptr,"glColor4s");
    glad_glColor4sv = (PFNGLCOLOR4SVPROC)(*p_Var2)(userptr,"glColor4sv");
    glad_glColor4ub = (PFNGLCOLOR4UBPROC)(*p_Var2)(userptr,"glColor4ub");
    glad_glColor4ubv = (PFNGLCOLOR4UBVPROC)(*p_Var2)(userptr,"glColor4ubv");
    glad_glColor4ui = (PFNGLCOLOR4UIPROC)(*p_Var2)(userptr,"glColor4ui");
    glad_glColor4uiv = (PFNGLCOLOR4UIVPROC)(*p_Var2)(userptr,"glColor4uiv");
    glad_glColor4us = (PFNGLCOLOR4USPROC)(*p_Var2)(userptr,"glColor4us");
    glad_glColor4usv = (PFNGLCOLOR4USVPROC)(*p_Var2)(userptr,"glColor4usv");
    glad_glColorMask = (PFNGLCOLORMASKPROC)(*p_Var2)(userptr,"glColorMask");
    glad_glColorMaterial = (PFNGLCOLORMATERIALPROC)(*p_Var2)(userptr,"glColorMaterial");
    glad_glCopyPixels = (PFNGLCOPYPIXELSPROC)(*p_Var2)(userptr,"glCopyPixels");
    glad_glCullFace = (PFNGLCULLFACEPROC)(*p_Var2)(userptr,"glCullFace");
    glad_glDeleteLists = (PFNGLDELETELISTSPROC)(*p_Var2)(userptr,"glDeleteLists");
    glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*p_Var2)(userptr,"glDepthFunc");
    glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*p_Var2)(userptr,"glDepthMask");
    glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*p_Var2)(userptr,"glDepthRange");
    glad_glDisable = (PFNGLDISABLEPROC)(*p_Var2)(userptr,"glDisable");
    glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*p_Var2)(userptr,"glDrawBuffer");
    glad_glDrawPixels = (PFNGLDRAWPIXELSPROC)(*p_Var2)(userptr,"glDrawPixels");
    glad_glEdgeFlag = (PFNGLEDGEFLAGPROC)(*p_Var2)(userptr,"glEdgeFlag");
    glad_glEdgeFlagv = (PFNGLEDGEFLAGVPROC)(*p_Var2)(userptr,"glEdgeFlagv");
    glad_glEnable = (PFNGLENABLEPROC)(*p_Var2)(userptr,"glEnable");
    glad_glEnd = (*p_Var2)(userptr,"glEnd");
    glad_glEndList = (*p_Var2)(userptr,"glEndList");
    glad_glEvalCoord1d = (PFNGLEVALCOORD1DPROC)(*p_Var2)(userptr,"glEvalCoord1d");
    glad_glEvalCoord1dv = (PFNGLEVALCOORD1DVPROC)(*p_Var2)(userptr,"glEvalCoord1dv");
    glad_glEvalCoord1f = (PFNGLEVALCOORD1FPROC)(*p_Var2)(userptr,"glEvalCoord1f");
    glad_glEvalCoord1fv = (PFNGLEVALCOORD1FVPROC)(*p_Var2)(userptr,"glEvalCoord1fv");
    glad_glEvalCoord2d = (PFNGLEVALCOORD2DPROC)(*p_Var2)(userptr,"glEvalCoord2d");
    glad_glEvalCoord2dv = (PFNGLEVALCOORD2DVPROC)(*p_Var2)(userptr,"glEvalCoord2dv");
    glad_glEvalCoord2f = (PFNGLEVALCOORD2FPROC)(*p_Var2)(userptr,"glEvalCoord2f");
    glad_glEvalCoord2fv = (PFNGLEVALCOORD2FVPROC)(*p_Var2)(userptr,"glEvalCoord2fv");
    glad_glEvalMesh1 = (PFNGLEVALMESH1PROC)(*p_Var2)(userptr,"glEvalMesh1");
    glad_glEvalMesh2 = (PFNGLEVALMESH2PROC)(*p_Var2)(userptr,"glEvalMesh2");
    glad_glEvalPoint1 = (PFNGLEVALPOINT1PROC)(*p_Var2)(userptr,"glEvalPoint1");
    glad_glEvalPoint2 = (PFNGLEVALPOINT2PROC)(*p_Var2)(userptr,"glEvalPoint2");
    glad_glFeedbackBuffer = (PFNGLFEEDBACKBUFFERPROC)(*p_Var2)(userptr,"glFeedbackBuffer");
    glad_glFinish = (*p_Var2)(userptr,"glFinish");
    glad_glFlush = (*p_Var2)(userptr,"glFlush");
    glad_glFogf = (PFNGLFOGFPROC)(*p_Var2)(userptr,"glFogf");
    glad_glFogfv = (PFNGLFOGFVPROC)(*p_Var2)(userptr,"glFogfv");
    glad_glFogi = (PFNGLFOGIPROC)(*p_Var2)(userptr,"glFogi");
    glad_glFogiv = (PFNGLFOGIVPROC)(*p_Var2)(userptr,"glFogiv");
    glad_glFrontFace = (PFNGLFRONTFACEPROC)(*p_Var2)(userptr,"glFrontFace");
    glad_glFrustum = (PFNGLFRUSTUMPROC)(*p_Var2)(userptr,"glFrustum");
    glad_glGenLists = (PFNGLGENLISTSPROC)(*p_Var2)(userptr,"glGenLists");
    glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*p_Var2)(userptr,"glGetBooleanv");
    glad_glGetClipPlane = (PFNGLGETCLIPPLANEPROC)(*p_Var2)(userptr,"glGetClipPlane");
    glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*p_Var2)(userptr,"glGetDoublev");
    glad_glGetError = (PFNGLGETERRORPROC)(*p_Var2)(userptr,"glGetError");
    glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*p_Var2)(userptr,"glGetFloatv");
    glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*p_Var2)(userptr,"glGetIntegerv");
    glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)(*p_Var2)(userptr,"glGetLightfv");
    glad_glGetLightiv = (PFNGLGETLIGHTIVPROC)(*p_Var2)(userptr,"glGetLightiv");
    glad_glGetMapdv = (PFNGLGETMAPDVPROC)(*p_Var2)(userptr,"glGetMapdv");
    glad_glGetMapfv = (PFNGLGETMAPFVPROC)(*p_Var2)(userptr,"glGetMapfv");
    glad_glGetMapiv = (PFNGLGETMAPIVPROC)(*p_Var2)(userptr,"glGetMapiv");
    glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)(*p_Var2)(userptr,"glGetMaterialfv");
    glad_glGetMaterialiv = (PFNGLGETMATERIALIVPROC)(*p_Var2)(userptr,"glGetMaterialiv");
    glad_glGetPixelMapfv = (PFNGLGETPIXELMAPFVPROC)(*p_Var2)(userptr,"glGetPixelMapfv");
    glad_glGetPixelMapuiv = (PFNGLGETPIXELMAPUIVPROC)(*p_Var2)(userptr,"glGetPixelMapuiv");
    glad_glGetPixelMapusv = (PFNGLGETPIXELMAPUSVPROC)(*p_Var2)(userptr,"glGetPixelMapusv");
    glad_glGetPolygonStipple = (PFNGLGETPOLYGONSTIPPLEPROC)(*p_Var2)(userptr,"glGetPolygonStipple");
    glad_glGetString = (PFNGLGETSTRINGPROC)(*p_Var2)(userptr,"glGetString");
    glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)(*p_Var2)(userptr,"glGetTexEnvfv");
    glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)(*p_Var2)(userptr,"glGetTexEnviv");
    glad_glGetTexGendv = (PFNGLGETTEXGENDVPROC)(*p_Var2)(userptr,"glGetTexGendv");
    glad_glGetTexGenfv = (PFNGLGETTEXGENFVPROC)(*p_Var2)(userptr,"glGetTexGenfv");
    glad_glGetTexGeniv = (PFNGLGETTEXGENIVPROC)(*p_Var2)(userptr,"glGetTexGeniv");
    glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*p_Var2)(userptr,"glGetTexImage");
    glad_glGetTexLevelParameterfv =
         (PFNGLGETTEXLEVELPARAMETERFVPROC)(*p_Var2)(userptr,"glGetTexLevelParameterfv");
    glad_glGetTexLevelParameteriv =
         (PFNGLGETTEXLEVELPARAMETERIVPROC)(*p_Var2)(userptr,"glGetTexLevelParameteriv");
    glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*p_Var2)(userptr,"glGetTexParameterfv");
    glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*p_Var2)(userptr,"glGetTexParameteriv");
    glad_glHint = (PFNGLHINTPROC)(*p_Var2)(userptr,"glHint");
    glad_glIndexMask = (PFNGLINDEXMASKPROC)(*p_Var2)(userptr,"glIndexMask");
    glad_glIndexd = (PFNGLINDEXDPROC)(*p_Var2)(userptr,"glIndexd");
    glad_glIndexdv = (PFNGLINDEXDVPROC)(*p_Var2)(userptr,"glIndexdv");
    glad_glIndexf = (PFNGLINDEXFPROC)(*p_Var2)(userptr,"glIndexf");
    glad_glIndexfv = (PFNGLINDEXFVPROC)(*p_Var2)(userptr,"glIndexfv");
    glad_glIndexi = (PFNGLINDEXIPROC)(*p_Var2)(userptr,"glIndexi");
    glad_glIndexiv = (PFNGLINDEXIVPROC)(*p_Var2)(userptr,"glIndexiv");
    glad_glIndexs = (PFNGLINDEXSPROC)(*p_Var2)(userptr,"glIndexs");
    glad_glIndexsv = (PFNGLINDEXSVPROC)(*p_Var2)(userptr,"glIndexsv");
    glad_glInitNames = (*p_Var2)(userptr,"glInitNames");
    glad_glIsEnabled = (PFNGLISENABLEDPROC)(*p_Var2)(userptr,"glIsEnabled");
    glad_glIsList = (PFNGLISLISTPROC)(*p_Var2)(userptr,"glIsList");
    glad_glLightModelf = (PFNGLLIGHTMODELFPROC)(*p_Var2)(userptr,"glLightModelf");
    glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)(*p_Var2)(userptr,"glLightModelfv");
    glad_glLightModeli = (PFNGLLIGHTMODELIPROC)(*p_Var2)(userptr,"glLightModeli");
    glad_glLightModeliv = (PFNGLLIGHTMODELIVPROC)(*p_Var2)(userptr,"glLightModeliv");
    glad_glLightf = (PFNGLLIGHTFPROC)(*p_Var2)(userptr,"glLightf");
    glad_glLightfv = (PFNGLLIGHTFVPROC)(*p_Var2)(userptr,"glLightfv");
    glad_glLighti = (PFNGLLIGHTIPROC)(*p_Var2)(userptr,"glLighti");
    glad_glLightiv = (PFNGLLIGHTIVPROC)(*p_Var2)(userptr,"glLightiv");
    glad_glLineStipple = (PFNGLLINESTIPPLEPROC)(*p_Var2)(userptr,"glLineStipple");
    glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*p_Var2)(userptr,"glLineWidth");
    glad_glListBase = (PFNGLLISTBASEPROC)(*p_Var2)(userptr,"glListBase");
    glad_glLoadIdentity = (*p_Var2)(userptr,"glLoadIdentity");
    glad_glLoadMatrixd = (PFNGLLOADMATRIXDPROC)(*p_Var2)(userptr,"glLoadMatrixd");
    glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)(*p_Var2)(userptr,"glLoadMatrixf");
    glad_glLoadName = (PFNGLLOADNAMEPROC)(*p_Var2)(userptr,"glLoadName");
    glad_glLogicOp = (PFNGLLOGICOPPROC)(*p_Var2)(userptr,"glLogicOp");
    glad_glMap1d = (PFNGLMAP1DPROC)(*p_Var2)(userptr,"glMap1d");
    glad_glMap1f = (PFNGLMAP1FPROC)(*p_Var2)(userptr,"glMap1f");
    glad_glMap2d = (PFNGLMAP2DPROC)(*p_Var2)(userptr,"glMap2d");
    glad_glMap2f = (PFNGLMAP2FPROC)(*p_Var2)(userptr,"glMap2f");
    glad_glMapGrid1d = (PFNGLMAPGRID1DPROC)(*p_Var2)(userptr,"glMapGrid1d");
    glad_glMapGrid1f = (PFNGLMAPGRID1FPROC)(*p_Var2)(userptr,"glMapGrid1f");
    glad_glMapGrid2d = (PFNGLMAPGRID2DPROC)(*p_Var2)(userptr,"glMapGrid2d");
    glad_glMapGrid2f = (PFNGLMAPGRID2FPROC)(*p_Var2)(userptr,"glMapGrid2f");
    glad_glMaterialf = (PFNGLMATERIALFPROC)(*p_Var2)(userptr,"glMaterialf");
    glad_glMaterialfv = (PFNGLMATERIALFVPROC)(*p_Var2)(userptr,"glMaterialfv");
    glad_glMateriali = (PFNGLMATERIALIPROC)(*p_Var2)(userptr,"glMateriali");
    glad_glMaterialiv = (PFNGLMATERIALIVPROC)(*p_Var2)(userptr,"glMaterialiv");
    glad_glMatrixMode = (PFNGLMATRIXMODEPROC)(*p_Var2)(userptr,"glMatrixMode");
    glad_glMultMatrixd = (PFNGLMULTMATRIXDPROC)(*p_Var2)(userptr,"glMultMatrixd");
    glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)(*p_Var2)(userptr,"glMultMatrixf");
    glad_glNewList = (PFNGLNEWLISTPROC)(*p_Var2)(userptr,"glNewList");
    glad_glNormal3b = (PFNGLNORMAL3BPROC)(*p_Var2)(userptr,"glNormal3b");
    glad_glNormal3bv = (PFNGLNORMAL3BVPROC)(*p_Var2)(userptr,"glNormal3bv");
    glad_glNormal3d = (PFNGLNORMAL3DPROC)(*p_Var2)(userptr,"glNormal3d");
    glad_glNormal3dv = (PFNGLNORMAL3DVPROC)(*p_Var2)(userptr,"glNormal3dv");
    glad_glNormal3f = (PFNGLNORMAL3FPROC)(*p_Var2)(userptr,"glNormal3f");
    glad_glNormal3fv = (PFNGLNORMAL3FVPROC)(*p_Var2)(userptr,"glNormal3fv");
    glad_glNormal3i = (PFNGLNORMAL3IPROC)(*p_Var2)(userptr,"glNormal3i");
    glad_glNormal3iv = (PFNGLNORMAL3IVPROC)(*p_Var2)(userptr,"glNormal3iv");
    glad_glNormal3s = (PFNGLNORMAL3SPROC)(*p_Var2)(userptr,"glNormal3s");
    glad_glNormal3sv = (PFNGLNORMAL3SVPROC)(*p_Var2)(userptr,"glNormal3sv");
    glad_glOrtho = (PFNGLORTHOPROC)(*p_Var2)(userptr,"glOrtho");
    glad_glPassThrough = (PFNGLPASSTHROUGHPROC)(*p_Var2)(userptr,"glPassThrough");
    glad_glPixelMapfv = (PFNGLPIXELMAPFVPROC)(*p_Var2)(userptr,"glPixelMapfv");
    glad_glPixelMapuiv = (PFNGLPIXELMAPUIVPROC)(*p_Var2)(userptr,"glPixelMapuiv");
    glad_glPixelMapusv = (PFNGLPIXELMAPUSVPROC)(*p_Var2)(userptr,"glPixelMapusv");
    glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*p_Var2)(userptr,"glPixelStoref");
    glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*p_Var2)(userptr,"glPixelStorei");
    glad_glPixelTransferf = (PFNGLPIXELTRANSFERFPROC)(*p_Var2)(userptr,"glPixelTransferf");
    glad_glPixelTransferi = (PFNGLPIXELTRANSFERIPROC)(*p_Var2)(userptr,"glPixelTransferi");
    glad_glPixelZoom = (PFNGLPIXELZOOMPROC)(*p_Var2)(userptr,"glPixelZoom");
    glad_glPointSize = (PFNGLPOINTSIZEPROC)(*p_Var2)(userptr,"glPointSize");
    glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*p_Var2)(userptr,"glPolygonMode");
    glad_glPolygonStipple = (PFNGLPOLYGONSTIPPLEPROC)(*p_Var2)(userptr,"glPolygonStipple");
    glad_glPopAttrib = (*p_Var2)(userptr,"glPopAttrib");
    glad_glPopMatrix = (*p_Var2)(userptr,"glPopMatrix");
    glad_glPopName = (*p_Var2)(userptr,"glPopName");
    glad_glPushAttrib = (PFNGLPUSHATTRIBPROC)(*p_Var2)(userptr,"glPushAttrib");
    glad_glPushMatrix = (*p_Var2)(userptr,"glPushMatrix");
    glad_glPushName = (PFNGLPUSHNAMEPROC)(*p_Var2)(userptr,"glPushName");
    glad_glRasterPos2d = (PFNGLRASTERPOS2DPROC)(*p_Var2)(userptr,"glRasterPos2d");
    glad_glRasterPos2dv = (PFNGLRASTERPOS2DVPROC)(*p_Var2)(userptr,"glRasterPos2dv");
    glad_glRasterPos2f = (PFNGLRASTERPOS2FPROC)(*p_Var2)(userptr,"glRasterPos2f");
    glad_glRasterPos2fv = (PFNGLRASTERPOS2FVPROC)(*p_Var2)(userptr,"glRasterPos2fv");
    glad_glRasterPos2i = (PFNGLRASTERPOS2IPROC)(*p_Var2)(userptr,"glRasterPos2i");
    glad_glRasterPos2iv = (PFNGLRASTERPOS2IVPROC)(*p_Var2)(userptr,"glRasterPos2iv");
    glad_glRasterPos2s = (PFNGLRASTERPOS2SPROC)(*p_Var2)(userptr,"glRasterPos2s");
    glad_glRasterPos2sv = (PFNGLRASTERPOS2SVPROC)(*p_Var2)(userptr,"glRasterPos2sv");
    glad_glRasterPos3d = (PFNGLRASTERPOS3DPROC)(*p_Var2)(userptr,"glRasterPos3d");
    glad_glRasterPos3dv = (PFNGLRASTERPOS3DVPROC)(*p_Var2)(userptr,"glRasterPos3dv");
    glad_glRasterPos3f = (PFNGLRASTERPOS3FPROC)(*p_Var2)(userptr,"glRasterPos3f");
    glad_glRasterPos3fv = (PFNGLRASTERPOS3FVPROC)(*p_Var2)(userptr,"glRasterPos3fv");
    glad_glRasterPos3i = (PFNGLRASTERPOS3IPROC)(*p_Var2)(userptr,"glRasterPos3i");
    glad_glRasterPos3iv = (PFNGLRASTERPOS3IVPROC)(*p_Var2)(userptr,"glRasterPos3iv");
    glad_glRasterPos3s = (PFNGLRASTERPOS3SPROC)(*p_Var2)(userptr,"glRasterPos3s");
    glad_glRasterPos3sv = (PFNGLRASTERPOS3SVPROC)(*p_Var2)(userptr,"glRasterPos3sv");
    glad_glRasterPos4d = (PFNGLRASTERPOS4DPROC)(*p_Var2)(userptr,"glRasterPos4d");
    glad_glRasterPos4dv = (PFNGLRASTERPOS4DVPROC)(*p_Var2)(userptr,"glRasterPos4dv");
    glad_glRasterPos4f = (PFNGLRASTERPOS4FPROC)(*p_Var2)(userptr,"glRasterPos4f");
    glad_glRasterPos4fv = (PFNGLRASTERPOS4FVPROC)(*p_Var2)(userptr,"glRasterPos4fv");
    glad_glRasterPos4i = (PFNGLRASTERPOS4IPROC)(*p_Var2)(userptr,"glRasterPos4i");
    glad_glRasterPos4iv = (PFNGLRASTERPOS4IVPROC)(*p_Var2)(userptr,"glRasterPos4iv");
    glad_glRasterPos4s = (PFNGLRASTERPOS4SPROC)(*p_Var2)(userptr,"glRasterPos4s");
    glad_glRasterPos4sv = (PFNGLRASTERPOS4SVPROC)(*p_Var2)(userptr,"glRasterPos4sv");
    glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*p_Var2)(userptr,"glReadBuffer");
    glad_glReadPixels = (PFNGLREADPIXELSPROC)(*p_Var2)(userptr,"glReadPixels");
    glad_glRectd = (PFNGLRECTDPROC)(*p_Var2)(userptr,"glRectd");
    glad_glRectdv = (PFNGLRECTDVPROC)(*p_Var2)(userptr,"glRectdv");
    glad_glRectf = (PFNGLRECTFPROC)(*p_Var2)(userptr,"glRectf");
    glad_glRectfv = (PFNGLRECTFVPROC)(*p_Var2)(userptr,"glRectfv");
    glad_glRecti = (PFNGLRECTIPROC)(*p_Var2)(userptr,"glRecti");
    glad_glRectiv = (PFNGLRECTIVPROC)(*p_Var2)(userptr,"glRectiv");
    glad_glRects = (PFNGLRECTSPROC)(*p_Var2)(userptr,"glRects");
    glad_glRectsv = (PFNGLRECTSVPROC)(*p_Var2)(userptr,"glRectsv");
    glad_glRenderMode = (PFNGLRENDERMODEPROC)(*p_Var2)(userptr,"glRenderMode");
    glad_glRotated = (PFNGLROTATEDPROC)(*p_Var2)(userptr,"glRotated");
    glad_glRotatef = (PFNGLROTATEFPROC)(*p_Var2)(userptr,"glRotatef");
    glad_glScaled = (PFNGLSCALEDPROC)(*p_Var2)(userptr,"glScaled");
    glad_glScalef = (PFNGLSCALEFPROC)(*p_Var2)(userptr,"glScalef");
    glad_glScissor = (PFNGLSCISSORPROC)(*p_Var2)(userptr,"glScissor");
    glad_glSelectBuffer = (PFNGLSELECTBUFFERPROC)(*p_Var2)(userptr,"glSelectBuffer");
    glad_glShadeModel = (PFNGLSHADEMODELPROC)(*p_Var2)(userptr,"glShadeModel");
    glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*p_Var2)(userptr,"glStencilFunc");
    glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*p_Var2)(userptr,"glStencilMask");
    glad_glStencilOp = (PFNGLSTENCILOPPROC)(*p_Var2)(userptr,"glStencilOp");
    glad_glTexCoord1d = (PFNGLTEXCOORD1DPROC)(*p_Var2)(userptr,"glTexCoord1d");
    glad_glTexCoord1dv = (PFNGLTEXCOORD1DVPROC)(*p_Var2)(userptr,"glTexCoord1dv");
    glad_glTexCoord1f = (PFNGLTEXCOORD1FPROC)(*p_Var2)(userptr,"glTexCoord1f");
    glad_glTexCoord1fv = (PFNGLTEXCOORD1FVPROC)(*p_Var2)(userptr,"glTexCoord1fv");
    glad_glTexCoord1i = (PFNGLTEXCOORD1IPROC)(*p_Var2)(userptr,"glTexCoord1i");
    glad_glTexCoord1iv = (PFNGLTEXCOORD1IVPROC)(*p_Var2)(userptr,"glTexCoord1iv");
    glad_glTexCoord1s = (PFNGLTEXCOORD1SPROC)(*p_Var2)(userptr,"glTexCoord1s");
    glad_glTexCoord1sv = (PFNGLTEXCOORD1SVPROC)(*p_Var2)(userptr,"glTexCoord1sv");
    glad_glTexCoord2d = (PFNGLTEXCOORD2DPROC)(*p_Var2)(userptr,"glTexCoord2d");
    glad_glTexCoord2dv = (PFNGLTEXCOORD2DVPROC)(*p_Var2)(userptr,"glTexCoord2dv");
    glad_glTexCoord2f = (PFNGLTEXCOORD2FPROC)(*p_Var2)(userptr,"glTexCoord2f");
    glad_glTexCoord2fv = (PFNGLTEXCOORD2FVPROC)(*p_Var2)(userptr,"glTexCoord2fv");
    glad_glTexCoord2i = (PFNGLTEXCOORD2IPROC)(*p_Var2)(userptr,"glTexCoord2i");
    glad_glTexCoord2iv = (PFNGLTEXCOORD2IVPROC)(*p_Var2)(userptr,"glTexCoord2iv");
    glad_glTexCoord2s = (PFNGLTEXCOORD2SPROC)(*p_Var2)(userptr,"glTexCoord2s");
    glad_glTexCoord2sv = (PFNGLTEXCOORD2SVPROC)(*p_Var2)(userptr,"glTexCoord2sv");
    glad_glTexCoord3d = (PFNGLTEXCOORD3DPROC)(*p_Var2)(userptr,"glTexCoord3d");
    glad_glTexCoord3dv = (PFNGLTEXCOORD3DVPROC)(*p_Var2)(userptr,"glTexCoord3dv");
    glad_glTexCoord3f = (PFNGLTEXCOORD3FPROC)(*p_Var2)(userptr,"glTexCoord3f");
    glad_glTexCoord3fv = (PFNGLTEXCOORD3FVPROC)(*p_Var2)(userptr,"glTexCoord3fv");
    glad_glTexCoord3i = (PFNGLTEXCOORD3IPROC)(*p_Var2)(userptr,"glTexCoord3i");
    glad_glTexCoord3iv = (PFNGLTEXCOORD3IVPROC)(*p_Var2)(userptr,"glTexCoord3iv");
    glad_glTexCoord3s = (PFNGLTEXCOORD3SPROC)(*p_Var2)(userptr,"glTexCoord3s");
    glad_glTexCoord3sv = (PFNGLTEXCOORD3SVPROC)(*p_Var2)(userptr,"glTexCoord3sv");
    glad_glTexCoord4d = (PFNGLTEXCOORD4DPROC)(*p_Var2)(userptr,"glTexCoord4d");
    glad_glTexCoord4dv = (PFNGLTEXCOORD4DVPROC)(*p_Var2)(userptr,"glTexCoord4dv");
    glad_glTexCoord4f = (PFNGLTEXCOORD4FPROC)(*p_Var2)(userptr,"glTexCoord4f");
    glad_glTexCoord4fv = (PFNGLTEXCOORD4FVPROC)(*p_Var2)(userptr,"glTexCoord4fv");
    glad_glTexCoord4i = (PFNGLTEXCOORD4IPROC)(*p_Var2)(userptr,"glTexCoord4i");
    glad_glTexCoord4iv = (PFNGLTEXCOORD4IVPROC)(*p_Var2)(userptr,"glTexCoord4iv");
    glad_glTexCoord4s = (PFNGLTEXCOORD4SPROC)(*p_Var2)(userptr,"glTexCoord4s");
    glad_glTexCoord4sv = (PFNGLTEXCOORD4SVPROC)(*p_Var2)(userptr,"glTexCoord4sv");
    glad_glTexEnvf = (PFNGLTEXENVFPROC)(*p_Var2)(userptr,"glTexEnvf");
    glad_glTexEnvfv = (PFNGLTEXENVFVPROC)(*p_Var2)(userptr,"glTexEnvfv");
    glad_glTexEnvi = (PFNGLTEXENVIPROC)(*p_Var2)(userptr,"glTexEnvi");
    glad_glTexEnviv = (PFNGLTEXENVIVPROC)(*p_Var2)(userptr,"glTexEnviv");
    glad_glTexGend = (PFNGLTEXGENDPROC)(*p_Var2)(userptr,"glTexGend");
    glad_glTexGendv = (PFNGLTEXGENDVPROC)(*p_Var2)(userptr,"glTexGendv");
    glad_glTexGenf = (PFNGLTEXGENFPROC)(*p_Var2)(userptr,"glTexGenf");
    glad_glTexGenfv = (PFNGLTEXGENFVPROC)(*p_Var2)(userptr,"glTexGenfv");
    glad_glTexGeni = (PFNGLTEXGENIPROC)(*p_Var2)(userptr,"glTexGeni");
    glad_glTexGeniv = (PFNGLTEXGENIVPROC)(*p_Var2)(userptr,"glTexGeniv");
    glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*p_Var2)(userptr,"glTexImage1D");
    glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*p_Var2)(userptr,"glTexImage2D");
    glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*p_Var2)(userptr,"glTexParameterf");
    glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*p_Var2)(userptr,"glTexParameterfv");
    glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*p_Var2)(userptr,"glTexParameteri");
    glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*p_Var2)(userptr,"glTexParameteriv");
    glad_glTranslated = (PFNGLTRANSLATEDPROC)(*p_Var2)(userptr,"glTranslated");
    glad_glTranslatef = (PFNGLTRANSLATEFPROC)(*p_Var2)(userptr,"glTranslatef");
    glad_glVertex2d = (PFNGLVERTEX2DPROC)(*p_Var2)(userptr,"glVertex2d");
    glad_glVertex2dv = (PFNGLVERTEX2DVPROC)(*p_Var2)(userptr,"glVertex2dv");
    glad_glVertex2f = (PFNGLVERTEX2FPROC)(*p_Var2)(userptr,"glVertex2f");
    glad_glVertex2fv = (PFNGLVERTEX2FVPROC)(*p_Var2)(userptr,"glVertex2fv");
    glad_glVertex2i = (PFNGLVERTEX2IPROC)(*p_Var2)(userptr,"glVertex2i");
    glad_glVertex2iv = (PFNGLVERTEX2IVPROC)(*p_Var2)(userptr,"glVertex2iv");
    glad_glVertex2s = (PFNGLVERTEX2SPROC)(*p_Var2)(userptr,"glVertex2s");
    glad_glVertex2sv = (PFNGLVERTEX2SVPROC)(*p_Var2)(userptr,"glVertex2sv");
    glad_glVertex3d = (PFNGLVERTEX3DPROC)(*p_Var2)(userptr,"glVertex3d");
    glad_glVertex3dv = (PFNGLVERTEX3DVPROC)(*p_Var2)(userptr,"glVertex3dv");
    glad_glVertex3f = (PFNGLVERTEX3FPROC)(*p_Var2)(userptr,"glVertex3f");
    glad_glVertex3fv = (PFNGLVERTEX3FVPROC)(*p_Var2)(userptr,"glVertex3fv");
    glad_glVertex3i = (PFNGLVERTEX3IPROC)(*p_Var2)(userptr,"glVertex3i");
    glad_glVertex3iv = (PFNGLVERTEX3IVPROC)(*p_Var2)(userptr,"glVertex3iv");
    glad_glVertex3s = (PFNGLVERTEX3SPROC)(*p_Var2)(userptr,"glVertex3s");
    glad_glVertex3sv = (PFNGLVERTEX3SVPROC)(*p_Var2)(userptr,"glVertex3sv");
    glad_glVertex4d = (PFNGLVERTEX4DPROC)(*p_Var2)(userptr,"glVertex4d");
    glad_glVertex4dv = (PFNGLVERTEX4DVPROC)(*p_Var2)(userptr,"glVertex4dv");
    glad_glVertex4f = (PFNGLVERTEX4FPROC)(*p_Var2)(userptr,"glVertex4f");
    glad_glVertex4fv = (PFNGLVERTEX4FVPROC)(*p_Var2)(userptr,"glVertex4fv");
    glad_glVertex4i = (PFNGLVERTEX4IPROC)(*p_Var2)(userptr,"glVertex4i");
    glad_glVertex4iv = (PFNGLVERTEX4IVPROC)(*p_Var2)(userptr,"glVertex4iv");
    glad_glVertex4s = (PFNGLVERTEX4SPROC)(*p_Var2)(userptr,"glVertex4s");
    glad_glVertex4sv = (PFNGLVERTEX4SVPROC)(*p_Var2)(userptr,"glVertex4sv");
    glad_glViewport = (PFNGLVIEWPORTPROC)(*p_Var2)(userptr,"glViewport");
  }
  if (GLAD_GL_VERSION_1_1 != 0) {
    glad_glAreTexturesResident =
         (PFNGLARETEXTURESRESIDENTPROC)(*p_Var2)(userptr,"glAreTexturesResident");
    glad_glArrayElement = (PFNGLARRAYELEMENTPROC)(*p_Var2)(userptr,"glArrayElement");
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*p_Var2)(userptr,"glBindTexture");
    glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*p_Var2)(userptr,"glColorPointer");
    glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*p_Var2)(userptr,"glCopyTexImage1D");
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*p_Var2)(userptr,"glCopyTexImage2D");
    glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*p_Var2)(userptr,"glCopyTexSubImage1D");
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*p_Var2)(userptr,"glCopyTexSubImage2D");
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*p_Var2)(userptr,"glDeleteTextures");
    glad_glDisableClientState =
         (PFNGLDISABLECLIENTSTATEPROC)(*p_Var2)(userptr,"glDisableClientState");
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*p_Var2)(userptr,"glDrawArrays");
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*p_Var2)(userptr,"glDrawElements");
    glad_glEdgeFlagPointer = (PFNGLEDGEFLAGPOINTERPROC)(*p_Var2)(userptr,"glEdgeFlagPointer");
    glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*p_Var2)(userptr,"glEnableClientState");
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*p_Var2)(userptr,"glGenTextures");
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*p_Var2)(userptr,"glGetPointerv");
    glad_glIndexPointer = (PFNGLINDEXPOINTERPROC)(*p_Var2)(userptr,"glIndexPointer");
    glad_glIndexub = (PFNGLINDEXUBPROC)(*p_Var2)(userptr,"glIndexub");
    glad_glIndexubv = (PFNGLINDEXUBVPROC)(*p_Var2)(userptr,"glIndexubv");
    glad_glInterleavedArrays = (PFNGLINTERLEAVEDARRAYSPROC)(*p_Var2)(userptr,"glInterleavedArrays");
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*p_Var2)(userptr,"glIsTexture");
    glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*p_Var2)(userptr,"glNormalPointer");
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*p_Var2)(userptr,"glPolygonOffset");
    glad_glPopClientAttrib = (*p_Var2)(userptr,"glPopClientAttrib");
    glad_glPrioritizeTextures =
         (PFNGLPRIORITIZETEXTURESPROC)(*p_Var2)(userptr,"glPrioritizeTextures");
    glad_glPushClientAttrib = (PFNGLPUSHCLIENTATTRIBPROC)(*p_Var2)(userptr,"glPushClientAttrib");
    glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*p_Var2)(userptr,"glTexCoordPointer");
    glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*p_Var2)(userptr,"glTexSubImage1D");
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*p_Var2)(userptr,"glTexSubImage2D");
    glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*p_Var2)(userptr,"glVertexPointer");
  }
  if (GLAD_GL_VERSION_1_2 != 0) {
    glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*p_Var2)(userptr,"glCopyTexSubImage3D");
    glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*p_Var2)(userptr,"glDrawRangeElements");
    glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*p_Var2)(userptr,"glTexImage3D");
    glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*p_Var2)(userptr,"glTexSubImage3D");
  }
  if (GLAD_GL_VERSION_1_3 != 0) {
    glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*p_Var2)(userptr,"glActiveTexture");
    glad_glClientActiveTexture =
         (PFNGLCLIENTACTIVETEXTUREPROC)(*p_Var2)(userptr,"glClientActiveTexture");
    glad_glCompressedTexImage1D =
         (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*p_Var2)(userptr,"glCompressedTexImage1D");
    glad_glCompressedTexImage2D =
         (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*p_Var2)(userptr,"glCompressedTexImage2D");
    glad_glCompressedTexImage3D =
         (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*p_Var2)(userptr,"glCompressedTexImage3D");
    glad_glCompressedTexSubImage1D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*p_Var2)(userptr,"glCompressedTexSubImage1D");
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*p_Var2)(userptr,"glCompressedTexSubImage2D");
    glad_glCompressedTexSubImage3D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*p_Var2)(userptr,"glCompressedTexSubImage3D");
    glad_glGetCompressedTexImage =
         (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*p_Var2)(userptr,"glGetCompressedTexImage");
    glad_glLoadTransposeMatrixd =
         (PFNGLLOADTRANSPOSEMATRIXDPROC)(*p_Var2)(userptr,"glLoadTransposeMatrixd");
    glad_glLoadTransposeMatrixf =
         (PFNGLLOADTRANSPOSEMATRIXFPROC)(*p_Var2)(userptr,"glLoadTransposeMatrixf");
    glad_glMultTransposeMatrixd =
         (PFNGLMULTTRANSPOSEMATRIXDPROC)(*p_Var2)(userptr,"glMultTransposeMatrixd");
    glad_glMultTransposeMatrixf =
         (PFNGLMULTTRANSPOSEMATRIXFPROC)(*p_Var2)(userptr,"glMultTransposeMatrixf");
    glad_glMultiTexCoord1d = (PFNGLMULTITEXCOORD1DPROC)(*p_Var2)(userptr,"glMultiTexCoord1d");
    glad_glMultiTexCoord1dv = (PFNGLMULTITEXCOORD1DVPROC)(*p_Var2)(userptr,"glMultiTexCoord1dv");
    glad_glMultiTexCoord1f = (PFNGLMULTITEXCOORD1FPROC)(*p_Var2)(userptr,"glMultiTexCoord1f");
    glad_glMultiTexCoord1fv = (PFNGLMULTITEXCOORD1FVPROC)(*p_Var2)(userptr,"glMultiTexCoord1fv");
    glad_glMultiTexCoord1i = (PFNGLMULTITEXCOORD1IPROC)(*p_Var2)(userptr,"glMultiTexCoord1i");
    glad_glMultiTexCoord1iv = (PFNGLMULTITEXCOORD1IVPROC)(*p_Var2)(userptr,"glMultiTexCoord1iv");
    glad_glMultiTexCoord1s = (PFNGLMULTITEXCOORD1SPROC)(*p_Var2)(userptr,"glMultiTexCoord1s");
    glad_glMultiTexCoord1sv = (PFNGLMULTITEXCOORD1SVPROC)(*p_Var2)(userptr,"glMultiTexCoord1sv");
    glad_glMultiTexCoord2d = (PFNGLMULTITEXCOORD2DPROC)(*p_Var2)(userptr,"glMultiTexCoord2d");
    glad_glMultiTexCoord2dv = (PFNGLMULTITEXCOORD2DVPROC)(*p_Var2)(userptr,"glMultiTexCoord2dv");
    glad_glMultiTexCoord2f = (PFNGLMULTITEXCOORD2FPROC)(*p_Var2)(userptr,"glMultiTexCoord2f");
    glad_glMultiTexCoord2fv = (PFNGLMULTITEXCOORD2FVPROC)(*p_Var2)(userptr,"glMultiTexCoord2fv");
    glad_glMultiTexCoord2i = (PFNGLMULTITEXCOORD2IPROC)(*p_Var2)(userptr,"glMultiTexCoord2i");
    glad_glMultiTexCoord2iv = (PFNGLMULTITEXCOORD2IVPROC)(*p_Var2)(userptr,"glMultiTexCoord2iv");
    glad_glMultiTexCoord2s = (PFNGLMULTITEXCOORD2SPROC)(*p_Var2)(userptr,"glMultiTexCoord2s");
    glad_glMultiTexCoord2sv = (PFNGLMULTITEXCOORD2SVPROC)(*p_Var2)(userptr,"glMultiTexCoord2sv");
    glad_glMultiTexCoord3d = (PFNGLMULTITEXCOORD3DPROC)(*p_Var2)(userptr,"glMultiTexCoord3d");
    glad_glMultiTexCoord3dv = (PFNGLMULTITEXCOORD3DVPROC)(*p_Var2)(userptr,"glMultiTexCoord3dv");
    glad_glMultiTexCoord3f = (PFNGLMULTITEXCOORD3FPROC)(*p_Var2)(userptr,"glMultiTexCoord3f");
    glad_glMultiTexCoord3fv = (PFNGLMULTITEXCOORD3FVPROC)(*p_Var2)(userptr,"glMultiTexCoord3fv");
    glad_glMultiTexCoord3i = (PFNGLMULTITEXCOORD3IPROC)(*p_Var2)(userptr,"glMultiTexCoord3i");
    glad_glMultiTexCoord3iv = (PFNGLMULTITEXCOORD3IVPROC)(*p_Var2)(userptr,"glMultiTexCoord3iv");
    glad_glMultiTexCoord3s = (PFNGLMULTITEXCOORD3SPROC)(*p_Var2)(userptr,"glMultiTexCoord3s");
    glad_glMultiTexCoord3sv = (PFNGLMULTITEXCOORD3SVPROC)(*p_Var2)(userptr,"glMultiTexCoord3sv");
    glad_glMultiTexCoord4d = (PFNGLMULTITEXCOORD4DPROC)(*p_Var2)(userptr,"glMultiTexCoord4d");
    glad_glMultiTexCoord4dv = (PFNGLMULTITEXCOORD4DVPROC)(*p_Var2)(userptr,"glMultiTexCoord4dv");
    glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)(*p_Var2)(userptr,"glMultiTexCoord4f");
    glad_glMultiTexCoord4fv = (PFNGLMULTITEXCOORD4FVPROC)(*p_Var2)(userptr,"glMultiTexCoord4fv");
    glad_glMultiTexCoord4i = (PFNGLMULTITEXCOORD4IPROC)(*p_Var2)(userptr,"glMultiTexCoord4i");
    glad_glMultiTexCoord4iv = (PFNGLMULTITEXCOORD4IVPROC)(*p_Var2)(userptr,"glMultiTexCoord4iv");
    glad_glMultiTexCoord4s = (PFNGLMULTITEXCOORD4SPROC)(*p_Var2)(userptr,"glMultiTexCoord4s");
    glad_glMultiTexCoord4sv = (PFNGLMULTITEXCOORD4SVPROC)(*p_Var2)(userptr,"glMultiTexCoord4sv");
    glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*p_Var2)(userptr,"glSampleCoverage");
  }
  if (GLAD_GL_VERSION_1_4 != 0) {
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*p_Var2)(userptr,"glBlendColor");
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*p_Var2)(userptr,"glBlendEquation");
    glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*p_Var2)(userptr,"glBlendFuncSeparate");
    glad_glFogCoordPointer = (PFNGLFOGCOORDPOINTERPROC)(*p_Var2)(userptr,"glFogCoordPointer");
    glad_glFogCoordd = (PFNGLFOGCOORDDPROC)(*p_Var2)(userptr,"glFogCoordd");
    glad_glFogCoorddv = (PFNGLFOGCOORDDVPROC)(*p_Var2)(userptr,"glFogCoorddv");
    glad_glFogCoordf = (PFNGLFOGCOORDFPROC)(*p_Var2)(userptr,"glFogCoordf");
    glad_glFogCoordfv = (PFNGLFOGCOORDFVPROC)(*p_Var2)(userptr,"glFogCoordfv");
    glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*p_Var2)(userptr,"glMultiDrawArrays");
    glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*p_Var2)(userptr,"glMultiDrawElements");
    glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*p_Var2)(userptr,"glPointParameterf");
    glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*p_Var2)(userptr,"glPointParameterfv");
    glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*p_Var2)(userptr,"glPointParameteri");
    glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*p_Var2)(userptr,"glPointParameteriv");
    glad_glSecondaryColor3b = (PFNGLSECONDARYCOLOR3BPROC)(*p_Var2)(userptr,"glSecondaryColor3b");
    glad_glSecondaryColor3bv = (PFNGLSECONDARYCOLOR3BVPROC)(*p_Var2)(userptr,"glSecondaryColor3bv");
    glad_glSecondaryColor3d = (PFNGLSECONDARYCOLOR3DPROC)(*p_Var2)(userptr,"glSecondaryColor3d");
    glad_glSecondaryColor3dv = (PFNGLSECONDARYCOLOR3DVPROC)(*p_Var2)(userptr,"glSecondaryColor3dv");
    glad_glSecondaryColor3f = (PFNGLSECONDARYCOLOR3FPROC)(*p_Var2)(userptr,"glSecondaryColor3f");
    glad_glSecondaryColor3fv = (PFNGLSECONDARYCOLOR3FVPROC)(*p_Var2)(userptr,"glSecondaryColor3fv");
    glad_glSecondaryColor3i = (PFNGLSECONDARYCOLOR3IPROC)(*p_Var2)(userptr,"glSecondaryColor3i");
    glad_glSecondaryColor3iv = (PFNGLSECONDARYCOLOR3IVPROC)(*p_Var2)(userptr,"glSecondaryColor3iv");
    glad_glSecondaryColor3s = (PFNGLSECONDARYCOLOR3SPROC)(*p_Var2)(userptr,"glSecondaryColor3s");
    glad_glSecondaryColor3sv = (PFNGLSECONDARYCOLOR3SVPROC)(*p_Var2)(userptr,"glSecondaryColor3sv");
    glad_glSecondaryColor3ub = (PFNGLSECONDARYCOLOR3UBPROC)(*p_Var2)(userptr,"glSecondaryColor3ub");
    glad_glSecondaryColor3ubv =
         (PFNGLSECONDARYCOLOR3UBVPROC)(*p_Var2)(userptr,"glSecondaryColor3ubv");
    glad_glSecondaryColor3ui = (PFNGLSECONDARYCOLOR3UIPROC)(*p_Var2)(userptr,"glSecondaryColor3ui");
    glad_glSecondaryColor3uiv =
         (PFNGLSECONDARYCOLOR3UIVPROC)(*p_Var2)(userptr,"glSecondaryColor3uiv");
    glad_glSecondaryColor3us = (PFNGLSECONDARYCOLOR3USPROC)(*p_Var2)(userptr,"glSecondaryColor3us");
    glad_glSecondaryColor3usv =
         (PFNGLSECONDARYCOLOR3USVPROC)(*p_Var2)(userptr,"glSecondaryColor3usv");
    glad_glSecondaryColorPointer =
         (PFNGLSECONDARYCOLORPOINTERPROC)(*p_Var2)(userptr,"glSecondaryColorPointer");
    glad_glWindowPos2d = (PFNGLWINDOWPOS2DPROC)(*p_Var2)(userptr,"glWindowPos2d");
    glad_glWindowPos2dv = (PFNGLWINDOWPOS2DVPROC)(*p_Var2)(userptr,"glWindowPos2dv");
    glad_glWindowPos2f = (PFNGLWINDOWPOS2FPROC)(*p_Var2)(userptr,"glWindowPos2f");
    glad_glWindowPos2fv = (PFNGLWINDOWPOS2FVPROC)(*p_Var2)(userptr,"glWindowPos2fv");
    glad_glWindowPos2i = (PFNGLWINDOWPOS2IPROC)(*p_Var2)(userptr,"glWindowPos2i");
    glad_glWindowPos2iv = (PFNGLWINDOWPOS2IVPROC)(*p_Var2)(userptr,"glWindowPos2iv");
    glad_glWindowPos2s = (PFNGLWINDOWPOS2SPROC)(*p_Var2)(userptr,"glWindowPos2s");
    glad_glWindowPos2sv = (PFNGLWINDOWPOS2SVPROC)(*p_Var2)(userptr,"glWindowPos2sv");
    glad_glWindowPos3d = (PFNGLWINDOWPOS3DPROC)(*p_Var2)(userptr,"glWindowPos3d");
    glad_glWindowPos3dv = (PFNGLWINDOWPOS3DVPROC)(*p_Var2)(userptr,"glWindowPos3dv");
    glad_glWindowPos3f = (PFNGLWINDOWPOS3FPROC)(*p_Var2)(userptr,"glWindowPos3f");
    glad_glWindowPos3fv = (PFNGLWINDOWPOS3FVPROC)(*p_Var2)(userptr,"glWindowPos3fv");
    glad_glWindowPos3i = (PFNGLWINDOWPOS3IPROC)(*p_Var2)(userptr,"glWindowPos3i");
    glad_glWindowPos3iv = (PFNGLWINDOWPOS3IVPROC)(*p_Var2)(userptr,"glWindowPos3iv");
    glad_glWindowPos3s = (PFNGLWINDOWPOS3SPROC)(*p_Var2)(userptr,"glWindowPos3s");
    glad_glWindowPos3sv = (PFNGLWINDOWPOS3SVPROC)(*p_Var2)(userptr,"glWindowPos3sv");
  }
  if (GLAD_GL_VERSION_1_5 != 0) {
    glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*p_Var2)(userptr,"glBeginQuery");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*p_Var2)(userptr,"glBindBuffer");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*p_Var2)(userptr,"glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*p_Var2)(userptr,"glBufferSubData");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*p_Var2)(userptr,"glDeleteBuffers");
    glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*p_Var2)(userptr,"glDeleteQueries");
    glad_glEndQuery = (PFNGLENDQUERYPROC)(*p_Var2)(userptr,"glEndQuery");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*p_Var2)(userptr,"glGenBuffers");
    glad_glGenQueries = (PFNGLGENQUERIESPROC)(*p_Var2)(userptr,"glGenQueries");
    glad_glGetBufferParameteriv =
         (PFNGLGETBUFFERPARAMETERIVPROC)(*p_Var2)(userptr,"glGetBufferParameteriv");
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*p_Var2)(userptr,"glGetBufferPointerv");
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*p_Var2)(userptr,"glGetBufferSubData");
    glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*p_Var2)(userptr,"glGetQueryObjectiv");
    glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*p_Var2)(userptr,"glGetQueryObjectuiv");
    glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*p_Var2)(userptr,"glGetQueryiv");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*p_Var2)(userptr,"glIsBuffer");
    glad_glIsQuery = (PFNGLISQUERYPROC)(*p_Var2)(userptr,"glIsQuery");
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*p_Var2)(userptr,"glMapBuffer");
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*p_Var2)(userptr,"glUnmapBuffer");
  }
  if (GLAD_GL_VERSION_2_0 != 0) {
    glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*p_Var2)(userptr,"glAttachShader");
    glad_glBindAttribLocation =
         (PFNGLBINDATTRIBLOCATIONPROC)(*p_Var2)(userptr,"glBindAttribLocation");
    glad_glBlendEquationSeparate =
         (PFNGLBLENDEQUATIONSEPARATEPROC)(*p_Var2)(userptr,"glBlendEquationSeparate");
    glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*p_Var2)(userptr,"glCompileShader");
    glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*p_Var2)(userptr,"glCreateProgram");
    glad_glCreateShader = (PFNGLCREATESHADERPROC)(*p_Var2)(userptr,"glCreateShader");
    glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*p_Var2)(userptr,"glDeleteProgram");
    glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*p_Var2)(userptr,"glDeleteShader");
    glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*p_Var2)(userptr,"glDetachShader");
    glad_glDisableVertexAttribArray =
         (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*p_Var2)(userptr,"glDisableVertexAttribArray");
    glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*p_Var2)(userptr,"glDrawBuffers");
    glad_glEnableVertexAttribArray =
         (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*p_Var2)(userptr,"glEnableVertexAttribArray");
    glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*p_Var2)(userptr,"glGetActiveAttrib");
    glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*p_Var2)(userptr,"glGetActiveUniform");
    glad_glGetAttachedShaders =
         (PFNGLGETATTACHEDSHADERSPROC)(*p_Var2)(userptr,"glGetAttachedShaders");
    glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*p_Var2)(userptr,"glGetAttribLocation");
    glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*p_Var2)(userptr,"glGetProgramInfoLog");
    glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*p_Var2)(userptr,"glGetProgramiv");
    glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*p_Var2)(userptr,"glGetShaderInfoLog");
    glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*p_Var2)(userptr,"glGetShaderSource");
    glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*p_Var2)(userptr,"glGetShaderiv");
    glad_glGetUniformLocation =
         (PFNGLGETUNIFORMLOCATIONPROC)(*p_Var2)(userptr,"glGetUniformLocation");
    glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*p_Var2)(userptr,"glGetUniformfv");
    glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*p_Var2)(userptr,"glGetUniformiv");
    glad_glGetVertexAttribPointerv =
         (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*p_Var2)(userptr,"glGetVertexAttribPointerv");
    glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*p_Var2)(userptr,"glGetVertexAttribdv");
    glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*p_Var2)(userptr,"glGetVertexAttribfv");
    glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*p_Var2)(userptr,"glGetVertexAttribiv");
    glad_glIsProgram = (PFNGLISPROGRAMPROC)(*p_Var2)(userptr,"glIsProgram");
    glad_glIsShader = (PFNGLISSHADERPROC)(*p_Var2)(userptr,"glIsShader");
    glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*p_Var2)(userptr,"glLinkProgram");
    glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*p_Var2)(userptr,"glShaderSource");
    glad_glStencilFuncSeparate =
         (PFNGLSTENCILFUNCSEPARATEPROC)(*p_Var2)(userptr,"glStencilFuncSeparate");
    glad_glStencilMaskSeparate =
         (PFNGLSTENCILMASKSEPARATEPROC)(*p_Var2)(userptr,"glStencilMaskSeparate");
    glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*p_Var2)(userptr,"glStencilOpSeparate");
    glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*p_Var2)(userptr,"glUniform1f");
    glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*p_Var2)(userptr,"glUniform1fv");
    glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*p_Var2)(userptr,"glUniform1i");
    glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*p_Var2)(userptr,"glUniform1iv");
    glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*p_Var2)(userptr,"glUniform2f");
    glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*p_Var2)(userptr,"glUniform2fv");
    glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*p_Var2)(userptr,"glUniform2i");
    glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*p_Var2)(userptr,"glUniform2iv");
    glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*p_Var2)(userptr,"glUniform3f");
    glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*p_Var2)(userptr,"glUniform3fv");
    glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*p_Var2)(userptr,"glUniform3i");
    glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*p_Var2)(userptr,"glUniform3iv");
    glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*p_Var2)(userptr,"glUniform4f");
    glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*p_Var2)(userptr,"glUniform4fv");
    glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*p_Var2)(userptr,"glUniform4i");
    glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*p_Var2)(userptr,"glUniform4iv");
    glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*p_Var2)(userptr,"glUniformMatrix2fv");
    glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*p_Var2)(userptr,"glUniformMatrix3fv");
    glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*p_Var2)(userptr,"glUniformMatrix4fv");
    glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*p_Var2)(userptr,"glUseProgram");
    glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*p_Var2)(userptr,"glValidateProgram");
    glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*p_Var2)(userptr,"glVertexAttrib1d");
    glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*p_Var2)(userptr,"glVertexAttrib1dv");
    glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*p_Var2)(userptr,"glVertexAttrib1f");
    glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*p_Var2)(userptr,"glVertexAttrib1fv");
    glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*p_Var2)(userptr,"glVertexAttrib1s");
    glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*p_Var2)(userptr,"glVertexAttrib1sv");
    glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*p_Var2)(userptr,"glVertexAttrib2d");
    glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*p_Var2)(userptr,"glVertexAttrib2dv");
    glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*p_Var2)(userptr,"glVertexAttrib2f");
    glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*p_Var2)(userptr,"glVertexAttrib2fv");
    glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*p_Var2)(userptr,"glVertexAttrib2s");
    glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*p_Var2)(userptr,"glVertexAttrib2sv");
    glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*p_Var2)(userptr,"glVertexAttrib3d");
    glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*p_Var2)(userptr,"glVertexAttrib3dv");
    glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*p_Var2)(userptr,"glVertexAttrib3f");
    glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*p_Var2)(userptr,"glVertexAttrib3fv");
    glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*p_Var2)(userptr,"glVertexAttrib3s");
    glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*p_Var2)(userptr,"glVertexAttrib3sv");
    glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*p_Var2)(userptr,"glVertexAttrib4Nbv");
    glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*p_Var2)(userptr,"glVertexAttrib4Niv");
    glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*p_Var2)(userptr,"glVertexAttrib4Nsv");
    glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*p_Var2)(userptr,"glVertexAttrib4Nub");
    glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*p_Var2)(userptr,"glVertexAttrib4Nubv");
    glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*p_Var2)(userptr,"glVertexAttrib4Nuiv");
    glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*p_Var2)(userptr,"glVertexAttrib4Nusv");
    glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*p_Var2)(userptr,"glVertexAttrib4bv");
    glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*p_Var2)(userptr,"glVertexAttrib4d");
    glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*p_Var2)(userptr,"glVertexAttrib4dv");
    glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*p_Var2)(userptr,"glVertexAttrib4f");
    glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*p_Var2)(userptr,"glVertexAttrib4fv");
    glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*p_Var2)(userptr,"glVertexAttrib4iv");
    glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*p_Var2)(userptr,"glVertexAttrib4s");
    glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*p_Var2)(userptr,"glVertexAttrib4sv");
    glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*p_Var2)(userptr,"glVertexAttrib4ubv");
    glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*p_Var2)(userptr,"glVertexAttrib4uiv");
    glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*p_Var2)(userptr,"glVertexAttrib4usv");
    glad_glVertexAttribPointer =
         (PFNGLVERTEXATTRIBPOINTERPROC)(*p_Var2)(userptr,"glVertexAttribPointer");
  }
  if (GLAD_GL_VERSION_2_1 != 0) {
    glad_glUniformMatrix2x3fv =
         (PFNGLUNIFORMMATRIX2X3FVPROC)(*p_Var2)(userptr,"glUniformMatrix2x3fv");
    glad_glUniformMatrix2x4fv =
         (PFNGLUNIFORMMATRIX2X4FVPROC)(*p_Var2)(userptr,"glUniformMatrix2x4fv");
    glad_glUniformMatrix3x2fv =
         (PFNGLUNIFORMMATRIX3X2FVPROC)(*p_Var2)(userptr,"glUniformMatrix3x2fv");
    glad_glUniformMatrix3x4fv =
         (PFNGLUNIFORMMATRIX3X4FVPROC)(*p_Var2)(userptr,"glUniformMatrix3x4fv");
    glad_glUniformMatrix4x2fv =
         (PFNGLUNIFORMMATRIX4X2FVPROC)(*p_Var2)(userptr,"glUniformMatrix4x2fv");
    glad_glUniformMatrix4x3fv =
         (PFNGLUNIFORMMATRIX4X3FVPROC)(*p_Var2)(userptr,"glUniformMatrix4x3fv");
  }
  if (GLAD_GL_VERSION_3_0 != 0) {
    glad_glBeginConditionalRender =
         (PFNGLBEGINCONDITIONALRENDERPROC)(*p_Var2)(userptr,"glBeginConditionalRender");
    glad_glBeginTransformFeedback =
         (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*p_Var2)(userptr,"glBeginTransformFeedback");
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*p_Var2)(userptr,"glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*p_Var2)(userptr,"glBindBufferRange");
    glad_glBindFragDataLocation =
         (PFNGLBINDFRAGDATALOCATIONPROC)(*p_Var2)(userptr,"glBindFragDataLocation");
    glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*p_Var2)(userptr,"glBindFramebuffer");
    glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*p_Var2)(userptr,"glBindRenderbuffer");
    glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*p_Var2)(userptr,"glBindVertexArray");
    glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*p_Var2)(userptr,"glBlitFramebuffer");
    glad_glCheckFramebufferStatus =
         (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*p_Var2)(userptr,"glCheckFramebufferStatus");
    glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*p_Var2)(userptr,"glClampColor");
    glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*p_Var2)(userptr,"glClearBufferfi");
    glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*p_Var2)(userptr,"glClearBufferfv");
    glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*p_Var2)(userptr,"glClearBufferiv");
    glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*p_Var2)(userptr,"glClearBufferuiv");
    glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*p_Var2)(userptr,"glColorMaski");
    glad_glDeleteFramebuffers =
         (PFNGLDELETEFRAMEBUFFERSPROC)(*p_Var2)(userptr,"glDeleteFramebuffers");
    glad_glDeleteRenderbuffers =
         (PFNGLDELETERENDERBUFFERSPROC)(*p_Var2)(userptr,"glDeleteRenderbuffers");
    glad_glDeleteVertexArrays =
         (PFNGLDELETEVERTEXARRAYSPROC)(*p_Var2)(userptr,"glDeleteVertexArrays");
    glad_glDisablei = (PFNGLDISABLEIPROC)(*p_Var2)(userptr,"glDisablei");
    glad_glEnablei = (PFNGLENABLEIPROC)(*p_Var2)(userptr,"glEnablei");
    glad_glEndConditionalRender = (*p_Var2)(userptr,"glEndConditionalRender");
    glad_glEndTransformFeedback = (*p_Var2)(userptr,"glEndTransformFeedback");
    glad_glFlushMappedBufferRange =
         (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*p_Var2)(userptr,"glFlushMappedBufferRange");
    glad_glFramebufferRenderbuffer =
         (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*p_Var2)(userptr,"glFramebufferRenderbuffer");
    glad_glFramebufferTexture1D =
         (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*p_Var2)(userptr,"glFramebufferTexture1D");
    glad_glFramebufferTexture2D =
         (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*p_Var2)(userptr,"glFramebufferTexture2D");
    glad_glFramebufferTexture3D =
         (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*p_Var2)(userptr,"glFramebufferTexture3D");
    glad_glFramebufferTextureLayer =
         (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*p_Var2)(userptr,"glFramebufferTextureLayer");
    glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*p_Var2)(userptr,"glGenFramebuffers");
    glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*p_Var2)(userptr,"glGenRenderbuffers");
    glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*p_Var2)(userptr,"glGenVertexArrays");
    glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*p_Var2)(userptr,"glGenerateMipmap");
    glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*p_Var2)(userptr,"glGetBooleani_v");
    glad_glGetFragDataLocation =
         (PFNGLGETFRAGDATALOCATIONPROC)(*p_Var2)(userptr,"glGetFragDataLocation");
    glad_glGetFramebufferAttachmentParameteriv =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*p_Var2)(userptr,"glGetFramebufferAttachmentParameteriv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*p_Var2)(userptr,"glGetIntegeri_v");
    glad_glGetRenderbufferParameteriv =
         (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*p_Var2)(userptr,"glGetRenderbufferParameteriv");
    glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*p_Var2)(userptr,"glGetStringi");
    glad_glGetTexParameterIiv =
         (PFNGLGETTEXPARAMETERIIVPROC)(*p_Var2)(userptr,"glGetTexParameterIiv");
    glad_glGetTexParameterIuiv =
         (PFNGLGETTEXPARAMETERIUIVPROC)(*p_Var2)(userptr,"glGetTexParameterIuiv");
    glad_glGetTransformFeedbackVarying =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*p_Var2)(userptr,"glGetTransformFeedbackVarying");
    glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*p_Var2)(userptr,"glGetUniformuiv");
    glad_glGetVertexAttribIiv =
         (PFNGLGETVERTEXATTRIBIIVPROC)(*p_Var2)(userptr,"glGetVertexAttribIiv");
    glad_glGetVertexAttribIuiv =
         (PFNGLGETVERTEXATTRIBIUIVPROC)(*p_Var2)(userptr,"glGetVertexAttribIuiv");
    glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*p_Var2)(userptr,"glIsEnabledi");
    glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*p_Var2)(userptr,"glIsFramebuffer");
    glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*p_Var2)(userptr,"glIsRenderbuffer");
    glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*p_Var2)(userptr,"glIsVertexArray");
    glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*p_Var2)(userptr,"glMapBufferRange");
    glad_glRenderbufferStorage =
         (PFNGLRENDERBUFFERSTORAGEPROC)(*p_Var2)(userptr,"glRenderbufferStorage");
    glad_glRenderbufferStorageMultisample =
         (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)
         (*p_Var2)(userptr,"glRenderbufferStorageMultisample");
    glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*p_Var2)(userptr,"glTexParameterIiv");
    glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*p_Var2)(userptr,"glTexParameterIuiv");
    glad_glTransformFeedbackVaryings =
         (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*p_Var2)(userptr,"glTransformFeedbackVaryings");
    glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*p_Var2)(userptr,"glUniform1ui");
    glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*p_Var2)(userptr,"glUniform1uiv");
    glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*p_Var2)(userptr,"glUniform2ui");
    glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*p_Var2)(userptr,"glUniform2uiv");
    glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*p_Var2)(userptr,"glUniform3ui");
    glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*p_Var2)(userptr,"glUniform3uiv");
    glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*p_Var2)(userptr,"glUniform4ui");
    glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*p_Var2)(userptr,"glUniform4uiv");
    glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*p_Var2)(userptr,"glVertexAttribI1i");
    glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*p_Var2)(userptr,"glVertexAttribI1iv");
    glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*p_Var2)(userptr,"glVertexAttribI1ui");
    glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*p_Var2)(userptr,"glVertexAttribI1uiv");
    glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*p_Var2)(userptr,"glVertexAttribI2i");
    glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*p_Var2)(userptr,"glVertexAttribI2iv");
    glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*p_Var2)(userptr,"glVertexAttribI2ui");
    glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*p_Var2)(userptr,"glVertexAttribI2uiv");
    glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*p_Var2)(userptr,"glVertexAttribI3i");
    glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*p_Var2)(userptr,"glVertexAttribI3iv");
    glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*p_Var2)(userptr,"glVertexAttribI3ui");
    glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*p_Var2)(userptr,"glVertexAttribI3uiv");
    glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*p_Var2)(userptr,"glVertexAttribI4bv");
    glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*p_Var2)(userptr,"glVertexAttribI4i");
    glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*p_Var2)(userptr,"glVertexAttribI4iv");
    glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*p_Var2)(userptr,"glVertexAttribI4sv");
    glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*p_Var2)(userptr,"glVertexAttribI4ubv");
    glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*p_Var2)(userptr,"glVertexAttribI4ui");
    glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*p_Var2)(userptr,"glVertexAttribI4uiv");
    glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*p_Var2)(userptr,"glVertexAttribI4usv");
    glad_glVertexAttribIPointer =
         (PFNGLVERTEXATTRIBIPOINTERPROC)(*p_Var2)(userptr,"glVertexAttribIPointer");
  }
  if (GLAD_GL_VERSION_3_1 != 0) {
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*p_Var2)(userptr,"glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*p_Var2)(userptr,"glBindBufferRange");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*p_Var2)(userptr,"glCopyBufferSubData");
    glad_glDrawArraysInstanced =
         (PFNGLDRAWARRAYSINSTANCEDPROC)(*p_Var2)(userptr,"glDrawArraysInstanced");
    glad_glDrawElementsInstanced =
         (PFNGLDRAWELEMENTSINSTANCEDPROC)(*p_Var2)(userptr,"glDrawElementsInstanced");
    glad_glGetActiveUniformBlockName =
         (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*p_Var2)(userptr,"glGetActiveUniformBlockName");
    glad_glGetActiveUniformBlockiv =
         (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*p_Var2)(userptr,"glGetActiveUniformBlockiv");
    glad_glGetActiveUniformName =
         (PFNGLGETACTIVEUNIFORMNAMEPROC)(*p_Var2)(userptr,"glGetActiveUniformName");
    glad_glGetActiveUniformsiv =
         (PFNGLGETACTIVEUNIFORMSIVPROC)(*p_Var2)(userptr,"glGetActiveUniformsiv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*p_Var2)(userptr,"glGetIntegeri_v");
    glad_glGetUniformBlockIndex =
         (PFNGLGETUNIFORMBLOCKINDEXPROC)(*p_Var2)(userptr,"glGetUniformBlockIndex");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*p_Var2)(userptr,"glGetUniformIndices");
    glad_glPrimitiveRestartIndex =
         (PFNGLPRIMITIVERESTARTINDEXPROC)(*p_Var2)(userptr,"glPrimitiveRestartIndex");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*p_Var2)(userptr,"glTexBuffer");
    glad_glUniformBlockBinding =
         (PFNGLUNIFORMBLOCKBINDINGPROC)(*p_Var2)(userptr,"glUniformBlockBinding");
  }
  if (GLAD_GL_VERSION_3_2 != 0) {
    glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*p_Var2)(userptr,"glClientWaitSync");
    glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*p_Var2)(userptr,"glDeleteSync");
    glad_glDrawElementsBaseVertex =
         (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*p_Var2)(userptr,"glDrawElementsBaseVertex");
    glad_glDrawElementsInstancedBaseVertex =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)
         (*p_Var2)(userptr,"glDrawElementsInstancedBaseVertex");
    glad_glDrawRangeElementsBaseVertex =
         (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*p_Var2)(userptr,"glDrawRangeElementsBaseVertex");
    glad_glFenceSync = (PFNGLFENCESYNCPROC)(*p_Var2)(userptr,"glFenceSync");
    glad_glFramebufferTexture =
         (PFNGLFRAMEBUFFERTEXTUREPROC)(*p_Var2)(userptr,"glFramebufferTexture");
    glad_glGetBufferParameteri64v =
         (PFNGLGETBUFFERPARAMETERI64VPROC)(*p_Var2)(userptr,"glGetBufferParameteri64v");
    glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*p_Var2)(userptr,"glGetInteger64i_v");
    glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*p_Var2)(userptr,"glGetInteger64v");
    glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*p_Var2)(userptr,"glGetMultisamplefv");
    glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*p_Var2)(userptr,"glGetSynciv");
    glad_glIsSync = (PFNGLISSYNCPROC)(*p_Var2)(userptr,"glIsSync");
    glad_glMultiDrawElementsBaseVertex =
         (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*p_Var2)(userptr,"glMultiDrawElementsBaseVertex");
    glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*p_Var2)(userptr,"glProvokingVertex");
    glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*p_Var2)(userptr,"glSampleMaski");
    glad_glTexImage2DMultisample =
         (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*p_Var2)(userptr,"glTexImage2DMultisample");
    glad_glTexImage3DMultisample =
         (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*p_Var2)(userptr,"glTexImage3DMultisample");
    glad_glWaitSync = (PFNGLWAITSYNCPROC)(*p_Var2)(userptr,"glWaitSync");
  }
  if (GLAD_GL_VERSION_3_3 != 0) {
    glad_glBindFragDataLocationIndexed =
         (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)(*p_Var2)(userptr,"glBindFragDataLocationIndexed");
    glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*p_Var2)(userptr,"glBindSampler");
    glad_glColorP3ui = (PFNGLCOLORP3UIPROC)(*p_Var2)(userptr,"glColorP3ui");
    glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)(*p_Var2)(userptr,"glColorP3uiv");
    glad_glColorP4ui = (PFNGLCOLORP4UIPROC)(*p_Var2)(userptr,"glColorP4ui");
    glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)(*p_Var2)(userptr,"glColorP4uiv");
    glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*p_Var2)(userptr,"glDeleteSamplers");
    glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*p_Var2)(userptr,"glGenSamplers");
    glad_glGetFragDataIndex = (PFNGLGETFRAGDATAINDEXPROC)(*p_Var2)(userptr,"glGetFragDataIndex");
    glad_glGetQueryObjecti64v =
         (PFNGLGETQUERYOBJECTI64VPROC)(*p_Var2)(userptr,"glGetQueryObjecti64v");
    glad_glGetQueryObjectui64v =
         (PFNGLGETQUERYOBJECTUI64VPROC)(*p_Var2)(userptr,"glGetQueryObjectui64v");
    glad_glGetSamplerParameterIiv =
         (PFNGLGETSAMPLERPARAMETERIIVPROC)(*p_Var2)(userptr,"glGetSamplerParameterIiv");
    glad_glGetSamplerParameterIuiv =
         (PFNGLGETSAMPLERPARAMETERIUIVPROC)(*p_Var2)(userptr,"glGetSamplerParameterIuiv");
    glad_glGetSamplerParameterfv =
         (PFNGLGETSAMPLERPARAMETERFVPROC)(*p_Var2)(userptr,"glGetSamplerParameterfv");
    glad_glGetSamplerParameteriv =
         (PFNGLGETSAMPLERPARAMETERIVPROC)(*p_Var2)(userptr,"glGetSamplerParameteriv");
    glad_glIsSampler = (PFNGLISSAMPLERPROC)(*p_Var2)(userptr,"glIsSampler");
    glad_glMultiTexCoordP1ui = (PFNGLMULTITEXCOORDP1UIPROC)(*p_Var2)(userptr,"glMultiTexCoordP1ui");
    glad_glMultiTexCoordP1uiv =
         (PFNGLMULTITEXCOORDP1UIVPROC)(*p_Var2)(userptr,"glMultiTexCoordP1uiv");
    glad_glMultiTexCoordP2ui = (PFNGLMULTITEXCOORDP2UIPROC)(*p_Var2)(userptr,"glMultiTexCoordP2ui");
    glad_glMultiTexCoordP2uiv =
         (PFNGLMULTITEXCOORDP2UIVPROC)(*p_Var2)(userptr,"glMultiTexCoordP2uiv");
    glad_glMultiTexCoordP3ui = (PFNGLMULTITEXCOORDP3UIPROC)(*p_Var2)(userptr,"glMultiTexCoordP3ui");
    glad_glMultiTexCoordP3uiv =
         (PFNGLMULTITEXCOORDP3UIVPROC)(*p_Var2)(userptr,"glMultiTexCoordP3uiv");
    glad_glMultiTexCoordP4ui = (PFNGLMULTITEXCOORDP4UIPROC)(*p_Var2)(userptr,"glMultiTexCoordP4ui");
    glad_glMultiTexCoordP4uiv =
         (PFNGLMULTITEXCOORDP4UIVPROC)(*p_Var2)(userptr,"glMultiTexCoordP4uiv");
    glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)(*p_Var2)(userptr,"glNormalP3ui");
    glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)(*p_Var2)(userptr,"glNormalP3uiv");
    glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)(*p_Var2)(userptr,"glQueryCounter");
    glad_glSamplerParameterIiv =
         (PFNGLSAMPLERPARAMETERIIVPROC)(*p_Var2)(userptr,"glSamplerParameterIiv");
    glad_glSamplerParameterIuiv =
         (PFNGLSAMPLERPARAMETERIUIVPROC)(*p_Var2)(userptr,"glSamplerParameterIuiv");
    glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*p_Var2)(userptr,"glSamplerParameterf");
    glad_glSamplerParameterfv =
         (PFNGLSAMPLERPARAMETERFVPROC)(*p_Var2)(userptr,"glSamplerParameterfv");
    glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*p_Var2)(userptr,"glSamplerParameteri");
    glad_glSamplerParameteriv =
         (PFNGLSAMPLERPARAMETERIVPROC)(*p_Var2)(userptr,"glSamplerParameteriv");
    glad_glSecondaryColorP3ui =
         (PFNGLSECONDARYCOLORP3UIPROC)(*p_Var2)(userptr,"glSecondaryColorP3ui");
    glad_glSecondaryColorP3uiv =
         (PFNGLSECONDARYCOLORP3UIVPROC)(*p_Var2)(userptr,"glSecondaryColorP3uiv");
    glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)(*p_Var2)(userptr,"glTexCoordP1ui");
    glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)(*p_Var2)(userptr,"glTexCoordP1uiv");
    glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)(*p_Var2)(userptr,"glTexCoordP2ui");
    glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)(*p_Var2)(userptr,"glTexCoordP2uiv");
    glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)(*p_Var2)(userptr,"glTexCoordP3ui");
    glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)(*p_Var2)(userptr,"glTexCoordP3uiv");
    glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)(*p_Var2)(userptr,"glTexCoordP4ui");
    glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)(*p_Var2)(userptr,"glTexCoordP4uiv");
    glad_glVertexAttribDivisor =
         (PFNGLVERTEXATTRIBDIVISORPROC)(*p_Var2)(userptr,"glVertexAttribDivisor");
    glad_glVertexAttribP1ui = (PFNGLVERTEXATTRIBP1UIPROC)(*p_Var2)(userptr,"glVertexAttribP1ui");
    glad_glVertexAttribP1uiv = (PFNGLVERTEXATTRIBP1UIVPROC)(*p_Var2)(userptr,"glVertexAttribP1uiv");
    glad_glVertexAttribP2ui = (PFNGLVERTEXATTRIBP2UIPROC)(*p_Var2)(userptr,"glVertexAttribP2ui");
    glad_glVertexAttribP2uiv = (PFNGLVERTEXATTRIBP2UIVPROC)(*p_Var2)(userptr,"glVertexAttribP2uiv");
    glad_glVertexAttribP3ui = (PFNGLVERTEXATTRIBP3UIPROC)(*p_Var2)(userptr,"glVertexAttribP3ui");
    glad_glVertexAttribP3uiv = (PFNGLVERTEXATTRIBP3UIVPROC)(*p_Var2)(userptr,"glVertexAttribP3uiv");
    glad_glVertexAttribP4ui = (PFNGLVERTEXATTRIBP4UIPROC)(*p_Var2)(userptr,"glVertexAttribP4ui");
    glad_glVertexAttribP4uiv = (PFNGLVERTEXATTRIBP4UIVPROC)(*p_Var2)(userptr,"glVertexAttribP4uiv");
    glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)(*p_Var2)(userptr,"glVertexP2ui");
    glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)(*p_Var2)(userptr,"glVertexP2uiv");
    glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)(*p_Var2)(userptr,"glVertexP3ui");
    glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)(*p_Var2)(userptr,"glVertexP3uiv");
    glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)(*p_Var2)(userptr,"glVertexP4ui");
    glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)(*p_Var2)(userptr,"glVertexP4uiv");
  }
  if (iVar3 < 30000) {
    ppcVar6 = (char **)glad_glGetString;
    if (glad_glGetString != (PFNGLGETSTRINGPROC)0x0) {
      pGVar4 = (*glad_glGetString)(0x1f03);
      uVar12 = 0;
      exts_i = (char **)0x0;
LAB_00109ed6:
      local_48 = 0;
      goto LAB_00109ee4;
    }
  }
  else {
    local_4c = 0;
    ppcVar6 = (char **)glad_glGetIntegerv;
    if (glad_glGetIntegerv != (PFNGLGETINTEGERVPROC)0x0 &&
        glad_glGetStringi != (PFNGLGETSTRINGIPROC)0x0) {
      ppcVar6 = (char **)(*glad_glGetIntegerv)(0x821d,(GLint *)&local_4c);
      uVar11 = local_4c;
      uVar12 = (ulong)local_4c;
      if (uVar12 == 0) {
        exts_i = (char **)0x0;
      }
      else {
        ppcVar6 = (char **)malloc(uVar12 * 8);
        exts_i = ppcVar6;
      }
      if (exts_i != (char **)0x0) {
        if (uVar11 != 0) {
          uVar9 = 0;
          do {
            pGVar4 = (*glad_glGetStringi)(0x1f03,(GLuint)uVar9);
            sVar5 = strlen((char *)pGVar4);
            pcVar7 = (char *)malloc(sVar5 + 1);
            if (pcVar7 != (char *)0x0) {
              memcpy(pcVar7,pGVar4,sVar5 + 1);
            }
            exts_i[uVar9] = pcVar7;
            uVar9 = uVar9 + 1;
            uVar12 = (ulong)local_4c;
          } while (uVar9 < uVar12);
        }
        pGVar4 = (GLubyte *)0x0;
        goto LAB_00109ed6;
      }
    }
  }
  local_48 = CONCAT71((int7)((ulong)ppcVar6 >> 8),1);
  pGVar4 = (GLubyte *)0x0;
  uVar12 = 0;
  exts_i = (char **)0x0;
LAB_00109ee4:
  iVar13 = 0;
  if ((char)local_48 == '\0') {
    uVar11 = (uint)uVar12;
    GLAD_GL_ARB_multisample =
         glad_gl_has_extension(iVar3,(char *)pGVar4,uVar11,exts_i,"GL_ARB_multisample");
    GLAD_GL_ARB_robustness =
         glad_gl_has_extension(iVar3,(char *)pGVar4,uVar11,exts_i,"GL_ARB_robustness");
    GLAD_GL_KHR_debug = glad_gl_has_extension(iVar3,(char *)pGVar4,uVar11,exts_i,"GL_KHR_debug");
    if (exts_i != (char **)0x0) {
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          free(exts_i[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
      }
      free(exts_i);
    }
    p_Var2 = local_38;
    iVar13 = 0;
    if ((char)local_48 == '\0') {
      if (GLAD_GL_ARB_multisample != 0) {
        glad_glSampleCoverageARB =
             (PFNGLSAMPLECOVERAGEARBPROC)(*local_38)(userptr,"glSampleCoverageARB");
      }
      if (GLAD_GL_ARB_robustness != 0) {
        glad_glGetGraphicsResetStatusARB =
             (PFNGLGETGRAPHICSRESETSTATUSARBPROC)(*p_Var2)(userptr,"glGetGraphicsResetStatusARB");
        glad_glGetnColorTableARB =
             (PFNGLGETNCOLORTABLEARBPROC)(*p_Var2)(userptr,"glGetnColorTableARB");
        glad_glGetnCompressedTexImageARB =
             (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC)(*p_Var2)(userptr,"glGetnCompressedTexImageARB");
        glad_glGetnConvolutionFilterARB =
             (PFNGLGETNCONVOLUTIONFILTERARBPROC)(*p_Var2)(userptr,"glGetnConvolutionFilterARB");
        glad_glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC)(*p_Var2)(userptr,"glGetnHistogramARB")
        ;
        glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC)(*p_Var2)(userptr,"glGetnMapdvARB");
        glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC)(*p_Var2)(userptr,"glGetnMapfvARB");
        glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC)(*p_Var2)(userptr,"glGetnMapivARB");
        glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC)(*p_Var2)(userptr,"glGetnMinmaxARB");
        glad_glGetnPixelMapfvARB =
             (PFNGLGETNPIXELMAPFVARBPROC)(*p_Var2)(userptr,"glGetnPixelMapfvARB");
        glad_glGetnPixelMapuivARB =
             (PFNGLGETNPIXELMAPUIVARBPROC)(*p_Var2)(userptr,"glGetnPixelMapuivARB");
        glad_glGetnPixelMapusvARB =
             (PFNGLGETNPIXELMAPUSVARBPROC)(*p_Var2)(userptr,"glGetnPixelMapusvARB");
        glad_glGetnPolygonStippleARB =
             (PFNGLGETNPOLYGONSTIPPLEARBPROC)(*p_Var2)(userptr,"glGetnPolygonStippleARB");
        glad_glGetnSeparableFilterARB =
             (PFNGLGETNSEPARABLEFILTERARBPROC)(*p_Var2)(userptr,"glGetnSeparableFilterARB");
        glad_glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC)(*p_Var2)(userptr,"glGetnTexImageARB");
        glad_glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC)(*p_Var2)(userptr,"glGetnUniformdvARB")
        ;
        glad_glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC)(*p_Var2)(userptr,"glGetnUniformfvARB")
        ;
        glad_glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC)(*p_Var2)(userptr,"glGetnUniformivARB")
        ;
        glad_glGetnUniformuivARB =
             (PFNGLGETNUNIFORMUIVARBPROC)(*p_Var2)(userptr,"glGetnUniformuivARB");
        glad_glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC)(*p_Var2)(userptr,"glReadnPixelsARB");
      }
      iVar13 = iVar3;
      if (GLAD_GL_KHR_debug != 0) {
        glad_glDebugMessageCallback =
             (PFNGLDEBUGMESSAGECALLBACKPROC)(*p_Var2)(userptr,"glDebugMessageCallback");
        glad_glDebugMessageControl =
             (PFNGLDEBUGMESSAGECONTROLPROC)(*p_Var2)(userptr,"glDebugMessageControl");
        glad_glDebugMessageInsert =
             (PFNGLDEBUGMESSAGEINSERTPROC)(*p_Var2)(userptr,"glDebugMessageInsert");
        glad_glGetDebugMessageLog =
             (PFNGLGETDEBUGMESSAGELOGPROC)(*p_Var2)(userptr,"glGetDebugMessageLog");
        glad_glGetObjectLabel = (PFNGLGETOBJECTLABELPROC)(*p_Var2)(userptr,"glGetObjectLabel");
        glad_glGetObjectPtrLabel =
             (PFNGLGETOBJECTPTRLABELPROC)(*p_Var2)(userptr,"glGetObjectPtrLabel");
        glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*p_Var2)(userptr,"glGetPointerv");
        glad_glObjectLabel = (PFNGLOBJECTLABELPROC)(*p_Var2)(userptr,"glObjectLabel");
        glad_glObjectPtrLabel = (PFNGLOBJECTPTRLABELPROC)(*p_Var2)(userptr,"glObjectPtrLabel");
        glad_glPopDebugGroup = (*p_Var2)(userptr,"glPopDebugGroup");
        glad_glPushDebugGroup = (PFNGLPUSHDEBUGGROUPPROC)(*p_Var2)(userptr,"glPushDebugGroup");
      }
    }
  }
  return iVar13;
}

Assistant:

int gladLoadGLUserPtr( GLADuserptrloadfunc load, void *userptr) {
    int version;

    glad_glGetString = (PFNGLGETSTRINGPROC) load(userptr, "glGetString");
    if(glad_glGetString == NULL) return 0;
    if(glad_glGetString(GL_VERSION) == NULL) return 0;
    version = glad_gl_find_core_gl();

    glad_gl_load_GL_VERSION_1_0(load, userptr);
    glad_gl_load_GL_VERSION_1_1(load, userptr);
    glad_gl_load_GL_VERSION_1_2(load, userptr);
    glad_gl_load_GL_VERSION_1_3(load, userptr);
    glad_gl_load_GL_VERSION_1_4(load, userptr);
    glad_gl_load_GL_VERSION_1_5(load, userptr);
    glad_gl_load_GL_VERSION_2_0(load, userptr);
    glad_gl_load_GL_VERSION_2_1(load, userptr);
    glad_gl_load_GL_VERSION_3_0(load, userptr);
    glad_gl_load_GL_VERSION_3_1(load, userptr);
    glad_gl_load_GL_VERSION_3_2(load, userptr);
    glad_gl_load_GL_VERSION_3_3(load, userptr);

    if (!glad_gl_find_extensions_gl(version)) return 0;
    glad_gl_load_GL_ARB_multisample(load, userptr);
    glad_gl_load_GL_ARB_robustness(load, userptr);
    glad_gl_load_GL_KHR_debug(load, userptr);



    return version;
}